

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void parseGPLFile(filebuf *file)

{
  pointer paVar1;
  bool bVar2;
  optional<Rgba> oVar3;
  undefined3 extraout_var;
  ushort i;
  string line;
  size_type n;
  ushort local_74;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_38;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  readLine(file,&local_70);
  local_50._M_len = local_70._M_string_length;
  local_50._M_str = local_70._M_dataplus._M_p;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                    (&local_50,"GIMP Palette");
  if (bVar2) {
    local_74 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
    i = 0;
    local_38 = &options.palSpec;
    while( true ) {
      local_70._M_string_length = 0;
      *local_70._M_dataplus._M_p = '\0';
      readLine(file,&local_70);
      if (local_70._M_string_length == 0) break;
      local_50._M_len = local_70._M_string_length;
      local_50._M_str = local_70._M_dataplus._M_p;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with(&local_50,"#");
      if (!bVar2) {
        local_50._M_len = local_70._M_string_length;
        local_50._M_str = local_70._M_dataplus._M_p;
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          (&local_50,"Name:");
        if (!bVar2) {
          local_50._M_len = local_70._M_string_length;
          local_50._M_str = local_70._M_dataplus._M_p;
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                            (&local_50,"Column:");
          if (!bVar2) {
            local_50._M_len = 0;
            i = i + 1;
            oVar3 = parseColor(&local_70,&local_50._M_len,i);
            local_40 = CONCAT35(extraout_var,
                                oVar3.super__Optional_base<Rgba,_true,_true>._M_payload.
                                super__Optional_payload_base<Rgba>);
            if (((uint5)oVar3.super__Optional_base<Rgba,_true,_true>._M_payload.
                        super__Optional_payload_base<Rgba> & 0x100000000) == 0) goto LAB_0010ca2a;
            if (i < local_74) {
              if ((ushort)(i % (ushort)options.nbColorsPerPal) == 1) {
                if (options.palSpec.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    options.palSpec.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
                  _M_realloc_insert<>(local_38,(iterator)
                                               options.palSpec.
                                               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
                }
                else {
                  paVar1 = options.palSpec.
                           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  paVar1->_M_elems[0].red = '\0';
                  paVar1->_M_elems[0].green = '\0';
                  paVar1->_M_elems[0].blue = '\0';
                  paVar1->_M_elems[0].alpha = '\0';
                  paVar1->_M_elems[1].red = '\0';
                  paVar1->_M_elems[1].green = '\0';
                  paVar1->_M_elems[1].blue = '\0';
                  paVar1->_M_elems[1].alpha = '\0';
                  paVar1->_M_elems[2].red = '\0';
                  paVar1->_M_elems[2].green = '\0';
                  paVar1->_M_elems[2].blue = '\0';
                  paVar1->_M_elems[2].alpha = '\0';
                  paVar1->_M_elems[3].red = '\0';
                  paVar1->_M_elems[3].green = '\0';
                  paVar1->_M_elems[3].blue = '\0';
                  paVar1->_M_elems[3].alpha = '\0';
                  options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       options.palSpec.
                       super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]._M_elems
              [(ushort)(i % (ushort)options.nbColorsPerPal)] = SUB84(local_40,0);
            }
          }
        }
      }
    }
    if (local_74 < i) {
      warning("GPL file contains %u colors, but there can only be %u; ignoring extra",(ulong)i);
    }
  }
  else {
    error("Palette file does not appear to be a GPL palette file");
  }
LAB_0010ca2a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void parseGPLFile(std::filebuf &file) {
	// https://gitlab.gnome.org/GNOME/gimp/-/blob/gimp-2-10/app/core/gimppalette-load.c#L39

	std::string line;
	readLine(file, line);
	if (!line.starts_with("GIMP Palette")) {
		error("Palette file does not appear to be a GPL palette file");
		return;
	}

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		line.clear();
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.starts_with("#") || line.starts_with("Name:") || line.starts_with("Column:")) {
			continue;
		}

		std::string::size_type n = 0;
		std::optional<Rgba> color = parseColor(line, n, nbColors + 1);
		if (!color) {
			return;
		}

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = *color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("GPL file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}